

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::ClassPropertySymbol::serializeTo(ClassPropertySymbol *this,ASTSerializer *serializer)

{
  size_t sVar1;
  
  VariableSymbol::serializeTo(&this->super_VariableSymbol,serializer);
  sVar1 = strlen(*(char **)(toString(slang::ast::Visibility)::strings +
                           (long)(int)this->visibility * 8));
  ASTSerializer::write(serializer,10,"visibility",sVar1);
  if ((long)(int)this->randMode != 0) {
    sVar1 = strlen(*(char **)(toString(slang::ast::RandMode)::strings +
                             (long)(int)this->randMode * 8));
    ASTSerializer::write(serializer,8,"randMode",sVar1);
    return;
  }
  return;
}

Assistant:

void ClassPropertySymbol::serializeTo(ASTSerializer& serializer) const {
    VariableSymbol::serializeTo(serializer);
    serializer.write("visibility", toString(visibility));
    if (randMode != RandMode::None)
        serializer.write("randMode", toString(randMode));
}